

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O3

UBool u_hasBinaryProperty_63(UChar32 c,UProperty which)

{
  UBool UVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  Normalizer2 *pNVar7;
  Normalizer2Impl *pNVar8;
  undefined8 src;
  byte bVar9;
  undefined4 uVar10;
  bool bVar11;
  UErrorCode UStack_dc;
  UnicodeString UStack_d8;
  UnicodeString UStack_98;
  ReorderingBuffer RStack_58;
  
  if (0x40 < (uint)which) {
    return '\0';
  }
  switch(which) {
  default:
    uVar3 = u_getUnicodeProperties_63(c,*(int32_t *)(&binProps + (ulong)(uint)which * 2));
    return (*(uint *)((long)&binProps + (ulong)(uint)which * 0x10 + 4) & uVar3) != 0;
  case UCHAR_BIDI_CONTROL:
    UVar1 = ubidi_isBidiControl_63(c);
    return UVar1;
  case UCHAR_BIDI_MIRRORED:
    UVar1 = ubidi_isMirrored_63(c);
    return UVar1;
  case UCHAR_FULL_COMPOSITION_EXCLUSION:
    RStack_58.codePointLimit = (UChar *)((ulong)RStack_58.codePointLimit & 0xffffffff);
    RStack_58.remainingCapacity = 0x186178;
    RStack_58.lastCC = '\0';
    RStack_58._45_3_ = 0;
    pNVar8 = icu_63::Normalizer2Factory::getNFCImpl
                       ((UErrorCode *)((long)&RStack_58.codePointLimit + 4));
    if (RStack_58.codePointLimit._4_4_ < 1) {
      RStack_58.remainingCapacity = 0x18618f;
      RStack_58.lastCC = '\0';
      RStack_58._45_3_ = 0;
      uVar2 = icu_63::Normalizer2Impl::getNorm16(pNVar8,c);
      bVar11 = uVar2 < pNVar8->minMaybeYes && pNVar8->minNoNo <= uVar2;
    }
    else {
      bVar11 = false;
    }
    return bVar11;
  case UCHAR_JOIN_CONTROL:
    UVar1 = ubidi_isJoinControl_63(c);
    return UVar1;
  case UCHAR_LOWERCASE:
  case UCHAR_SOFT_DOTTED:
  case UCHAR_UPPERCASE:
  case UCHAR_CASE_SENSITIVE:
  case UCHAR_CASED:
  case UCHAR_CASE_IGNORABLE:
  case UCHAR_CHANGES_WHEN_LOWERCASED:
  case UCHAR_CHANGES_WHEN_UPPERCASED:
  case UCHAR_CHANGES_WHEN_TITLECASED:
  case UCHAR_CHANGES_WHEN_CASEMAPPED:
    iVar4 = ucase_hasBinaryProperty_63(c,which);
    return (UBool)iVar4;
  case UCHAR_NFD_INERT:
  case UCHAR_NFKD_INERT:
  case UCHAR_NFC_INERT:
  case UCHAR_NFKC_INERT:
    RStack_58.codePointLimit = (UChar *)0x1861db;
    pNVar7 = icu_63::Normalizer2Factory::getInstance
                       (which - 0x23,(UErrorCode *)&stack0xffffffffffffffec);
    RStack_58.codePointLimit = L"삄锏䣀쒃嬈幁䇃䅗卖荈წ\xf389赌⑼䄌߇";
    iVar6 = (*(pNVar7->super_UObject)._vptr_UObject[0x11])(pNVar7,c);
    return (char)iVar6 != '\0';
  case UCHAR_SEGMENT_STARTER:
    RStack_58.codePointLimit = (UChar *)((ulong)RStack_58.codePointLimit & 0xffffffff);
    RStack_58.remainingCapacity = 0x18621f;
    RStack_58.lastCC = '\0';
    RStack_58._45_3_ = 0;
    pNVar8 = icu_63::Normalizer2Factory::getNFCImpl
                       ((UErrorCode *)((long)&RStack_58.codePointLimit + 4));
    if (RStack_58.codePointLimit._4_4_ < 1) {
      RStack_58.remainingCapacity = 0x186239;
      RStack_58.lastCC = '\0';
      RStack_58._45_3_ = 0;
      UVar1 = icu_63::Normalizer2Impl::ensureCanonIterData
                        (pNVar8,(UErrorCode *)((long)&RStack_58.codePointLimit + 4));
      if (UVar1 != '\0') {
        RStack_58.remainingCapacity = 0x186247;
        RStack_58.lastCC = '\0';
        RStack_58._45_3_ = 0;
        UVar1 = icu_63::Normalizer2Impl::isCanonSegmentStarter(pNVar8,c);
        return UVar1 != '\0';
      }
    }
    return '\0';
  case UCHAR_POSIX_ALNUM:
    UVar1 = u_isalnumPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_BLANK:
    UVar1 = u_isblank_63(c);
    return UVar1;
  case UCHAR_POSIX_GRAPH:
    UVar1 = u_isgraphPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_PRINT:
    UVar1 = u_isprintPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_XDIGIT:
    UVar1 = u_isxdigit_63(c);
    return UVar1;
  case UCHAR_CHANGES_WHEN_CASEFOLDED:
    break;
  case UCHAR_CHANGES_WHEN_NFKC_CASEFOLDED:
    UStack_dc = U_ZERO_ERROR;
    pNVar8 = icu_63::Normalizer2Factory::getNFKC_CFImpl(&UStack_dc);
    if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(&UStack_d8,c);
      RStack_58.str = &UStack_98;
      UStack_98.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_00249818;
      UStack_98.fUnion.fStackFields.fLengthAndFlags = 2;
      RStack_58.start = (UChar *)0x0;
      RStack_58.reorderStart._0_5_ = 0;
      RStack_58.reorderStart._5_3_ = 0;
      RStack_58.limit._0_5_ = 0;
      RStack_58.limit._5_3_ = 0;
      RStack_58.remainingCapacity = 0;
      RStack_58.lastCC = '\0';
      RStack_58.impl = pNVar8;
      iVar6 = icu_63::ReorderingBuffer::init(&RStack_58,(EVP_PKEY_CTX *)0x5);
      if ((char)iVar6 != '\0') {
        if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            UStack_d8.fUnion.fFields.fArray = UStack_d8.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          UStack_d8.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        uVar10 = UStack_d8.fUnion.fFields.fLength;
        if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
          uVar10 = (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        icu_63::Normalizer2Impl::compose
                  (pNVar8,UStack_d8.fUnion.fFields.fArray,
                   (char16_t *)((long)UStack_d8.fUnion.fFields.fArray + (long)(int)uVar10 * 2),'\0',
                   '\x01',&RStack_58,&UStack_dc);
      }
      icu_63::ReorderingBuffer::~ReorderingBuffer(&RStack_58);
      if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((UStack_98.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          if (-1 < UStack_98.fUnion.fStackFields.fLengthAndFlags) {
            UStack_98.fUnion.fFields.fLength =
                 (int)UStack_98.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
            UStack_d8.fUnion.fFields.fLength =
                 (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          bVar11 = false;
          if ((((int)UStack_d8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
             (bVar11 = false, UStack_98.fUnion.fFields.fLength == UStack_d8.fUnion.fFields.fLength))
          {
            UVar1 = icu_63::UnicodeString::doEquals
                              (&UStack_98,&UStack_d8,UStack_98.fUnion.fFields.fLength);
            bVar11 = UVar1 != '\0';
          }
        }
        else {
          bVar11 = (bool)(UStack_d8.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
        }
        bVar9 = bVar11 ^ 1;
      }
      else {
        bVar9 = 0;
      }
      icu_63::UnicodeString::~UnicodeString(&UStack_98);
      icu_63::UnicodeString::~UnicodeString(&UStack_d8);
    }
    else {
      bVar9 = 0;
    }
    return bVar9;
  case UCHAR_REGIONAL_INDICATOR:
    return c - 0x1f1e6U < 0x1a;
  }
  UStack_d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00249818;
  UStack_d8.fUnion.fStackFields.fLengthAndFlags = 2;
  UStack_dc = U_ZERO_ERROR;
  pNVar7 = icu_63::Normalizer2::getNFCInstance(&UStack_dc);
  if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar6 = (*(pNVar7->super_UObject)._vptr_UObject[7])(pNVar7,c,&UStack_d8);
    if ((char)iVar6 == '\0') {
      if (-1 < c) goto LAB_00186339;
    }
    else {
      uVar5 = (uint)UStack_d8.fUnion.fStackFields.fLengthAndFlags;
      uVar10 = UStack_d8.fUnion.fFields.fLength;
      if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
        uVar10 = (int)uVar5 >> 5;
      }
      if (uVar10 == 1) {
        if ((uVar5 & 2) != 0) {
          UStack_d8.fUnion.fFields.fArray = UStack_d8.fUnion.fStackFields.fBuffer;
        }
        c = (UChar32)(ushort)*UStack_d8.fUnion.fFields.fArray;
LAB_00186339:
        iVar4 = ucase_toFullFolding_63(c,(UChar **)&UStack_98,0);
        bVar11 = -1 < iVar4;
        goto LAB_0018634c;
      }
      if ((int)uVar10 < 3) {
        c = icu_63::UnicodeString::char32At(&UStack_d8,0);
        if ((-1 < c) && (uVar10 == 2 - (uint)((uint)c < 0x10000))) goto LAB_00186339;
        uVar5 = (uint)(ushort)UStack_d8.fUnion.fStackFields.fLengthAndFlags;
      }
      if ((uVar5 & 0x11) == 0) {
        src = UStack_d8.fUnion.fFields.fArray;
        if ((uVar5 & 2) != 0) {
          src = UStack_d8.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        src = (char16_t *)0x0;
      }
      uVar10 = UStack_d8.fUnion.fFields.fLength;
      if (-1 < (short)uVar5) {
        uVar10 = (int)(short)uVar5 >> 5;
      }
      iVar4 = u_strFoldCase_63((UChar *)&UStack_98,0x3e,(UChar *)src,uVar10,0,&UStack_dc);
      if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            UStack_d8.fUnion.fFields.fArray = UStack_d8.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          UStack_d8.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
          UStack_d8.fUnion.fFields.fLength = (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        iVar4 = u_strCompare_63(UStack_d8.fUnion.fFields.fArray,UStack_d8.fUnion.fFields.fLength,
                                (UChar *)&UStack_98,iVar4,'\0');
        bVar11 = iVar4 != 0;
        goto LAB_0018634c;
      }
    }
  }
  bVar11 = false;
LAB_0018634c:
  icu_63::UnicodeString::~UnicodeString(&UStack_d8);
  return bVar11;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_hasBinaryProperty(UChar32 c, UProperty which) {
    /* c is range-checked in the functions that are called from here */
    if(which<UCHAR_BINARY_START || UCHAR_BINARY_LIMIT<=which) {
        /* not a known binary property */
        return FALSE;
    } else {
        const BinaryProperty &prop=binProps[which];
        return prop.contains(prop, c, which);
    }
}